

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

_Bool ossl_data_pending(Curl_cfilter *cf,Curl_easy *data)

{
  long lVar1;
  int iVar2;
  ossl_ctx *octx;
  ssl_connect_data *connssl;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  lVar1 = *(long *)((long)cf->ctx + 0x30);
  if ((*(long *)(lVar1 + 8) != 0) && (iVar2 = SSL_pending(*(SSL **)(lVar1 + 8)), iVar2 != 0)) {
    return true;
  }
  return false;
}

Assistant:

static bool ossl_data_pending(struct Curl_cfilter *cf,
                              const struct Curl_easy *data)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(connssl && octx);
  if(octx->ssl && SSL_pending(octx->ssl))
    return TRUE;
  return FALSE;
}